

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimSnapshotManager.cpp
# Opt level: O2

bool __thiscall OpenMD::SimSnapshotManager::resetToPrevious(SimSnapshotManager *this)

{
  int id;
  
  id = Snapshot::getID((this->super_SnapshotManager).previousSnapshot_);
  Snapshot::operator=((this->super_SnapshotManager).currentSnapshot_,
                      (this->super_SnapshotManager).previousSnapshot_);
  Snapshot::setID((this->super_SnapshotManager).currentSnapshot_,id);
  return true;
}

Assistant:

bool SimSnapshotManager::resetToPrevious() {
    int prevID        = previousSnapshot_->getID();
    *currentSnapshot_ = *previousSnapshot_;
    currentSnapshot_->setID(prevID);
    return true;
  }